

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool __thiscall
bssl::tls13_psk_binder
          (bssl *this,uint8_t *out,size_t *out_len,SSL_SESSION *session,SSLTranscript *transcript,
          Span<const_unsigned_char> client_hello,size_t binders_len,bool is_dtls)

{
  long lVar1;
  string_view label;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> context_00;
  bool bVar2;
  int iVar3;
  EVP_MD *md;
  undefined4 extraout_var;
  ulong uVar4;
  uchar *d;
  undefined4 extraout_var_00;
  ulong cnt;
  Span<unsigned_char> out_00;
  Span<const_unsigned_char> SVar5;
  Span<const_unsigned_char> SVar6;
  uchar *md_00;
  uint context_len;
  uint binder_context_len;
  long *local_1d0;
  size_t local_1c8;
  ScopedEVP_MD_CTX ctx;
  Span<const_unsigned_char> truncated;
  size_t early_secret_len;
  uint8_t *local_178;
  ulong uStack_170;
  uchar *local_168;
  ulong uStack_160;
  undefined8 local_158;
  char *pcStack_150;
  Span<const_unsigned_char> client_hello_local;
  uint8_t binder_key_buf [64];
  uint8_t early_secret [64];
  uint8_t context [64];
  uint8_t binder_context [64];
  
  local_1d0 = (long *)out;
  client_hello_local.data_ = (uchar *)transcript;
  client_hello_local.size_ = binders_len;
  md = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)out_len);
  early_secret[0x30] = '\0';
  early_secret[0x31] = '\0';
  early_secret[0x32] = '\0';
  early_secret[0x33] = '\0';
  early_secret[0x34] = '\0';
  early_secret[0x35] = '\0';
  early_secret[0x36] = '\0';
  early_secret[0x37] = '\0';
  early_secret[0x38] = '\0';
  early_secret[0x39] = '\0';
  early_secret[0x3a] = '\0';
  early_secret[0x3b] = '\0';
  early_secret[0x3c] = '\0';
  early_secret[0x3d] = '\0';
  early_secret[0x3e] = '\0';
  early_secret[0x3f] = '\0';
  early_secret[0x20] = '\0';
  early_secret[0x21] = '\0';
  early_secret[0x22] = '\0';
  early_secret[0x23] = '\0';
  early_secret[0x24] = '\0';
  early_secret[0x25] = '\0';
  early_secret[0x26] = '\0';
  early_secret[0x27] = '\0';
  early_secret[0x28] = '\0';
  early_secret[0x29] = '\0';
  early_secret[0x2a] = '\0';
  early_secret[0x2b] = '\0';
  early_secret[0x2c] = '\0';
  early_secret[0x2d] = '\0';
  early_secret[0x2e] = '\0';
  early_secret[0x2f] = '\0';
  early_secret[0x10] = '\0';
  early_secret[0x11] = '\0';
  early_secret[0x12] = '\0';
  early_secret[0x13] = '\0';
  early_secret[0x14] = '\0';
  early_secret[0x15] = '\0';
  early_secret[0x16] = '\0';
  early_secret[0x17] = '\0';
  early_secret[0x18] = '\0';
  early_secret[0x19] = '\0';
  early_secret[0x1a] = '\0';
  early_secret[0x1b] = '\0';
  early_secret[0x1c] = '\0';
  early_secret[0x1d] = '\0';
  early_secret[0x1e] = '\0';
  early_secret[0x1f] = '\0';
  early_secret[0] = '\0';
  early_secret[1] = '\0';
  early_secret[2] = '\0';
  early_secret[3] = '\0';
  early_secret[4] = '\0';
  early_secret[5] = '\0';
  early_secret[6] = '\0';
  early_secret[7] = '\0';
  early_secret[8] = '\0';
  early_secret[9] = '\0';
  early_secret[10] = '\0';
  early_secret[0xb] = '\0';
  early_secret[0xc] = '\0';
  early_secret[0xd] = '\0';
  early_secret[0xe] = '\0';
  early_secret[0xf] = '\0';
  binder_key_buf[0x30] = '\0';
  binder_key_buf[0x31] = '\0';
  binder_key_buf[0x32] = '\0';
  binder_key_buf[0x33] = '\0';
  binder_key_buf[0x34] = '\0';
  binder_key_buf[0x35] = '\0';
  binder_key_buf[0x36] = '\0';
  binder_key_buf[0x37] = '\0';
  binder_key_buf[0x38] = '\0';
  binder_key_buf[0x39] = '\0';
  binder_key_buf[0x3a] = '\0';
  binder_key_buf[0x3b] = '\0';
  binder_key_buf[0x3c] = '\0';
  binder_key_buf[0x3d] = '\0';
  binder_key_buf[0x3e] = '\0';
  binder_key_buf[0x3f] = '\0';
  binder_key_buf[0x20] = '\0';
  binder_key_buf[0x21] = '\0';
  binder_key_buf[0x22] = '\0';
  binder_key_buf[0x23] = '\0';
  binder_key_buf[0x24] = '\0';
  binder_key_buf[0x25] = '\0';
  binder_key_buf[0x26] = '\0';
  binder_key_buf[0x27] = '\0';
  binder_key_buf[0x28] = '\0';
  binder_key_buf[0x29] = '\0';
  binder_key_buf[0x2a] = '\0';
  binder_key_buf[0x2b] = '\0';
  binder_key_buf[0x2c] = '\0';
  binder_key_buf[0x2d] = '\0';
  binder_key_buf[0x2e] = '\0';
  binder_key_buf[0x2f] = '\0';
  binder_key_buf[0x10] = '\0';
  binder_key_buf[0x11] = '\0';
  binder_key_buf[0x12] = '\0';
  binder_key_buf[0x13] = '\0';
  binder_key_buf[0x14] = '\0';
  binder_key_buf[0x15] = '\0';
  binder_key_buf[0x16] = '\0';
  binder_key_buf[0x17] = '\0';
  binder_key_buf[0x18] = '\0';
  binder_key_buf[0x19] = '\0';
  binder_key_buf[0x1a] = '\0';
  binder_key_buf[0x1b] = '\0';
  binder_key_buf[0x1c] = '\0';
  binder_key_buf[0x1d] = '\0';
  binder_key_buf[0x1e] = '\0';
  binder_key_buf[0x1f] = '\0';
  binder_key_buf[0] = '\0';
  binder_key_buf[1] = '\0';
  binder_key_buf[2] = '\0';
  binder_key_buf[3] = '\0';
  binder_key_buf[4] = '\0';
  binder_key_buf[5] = '\0';
  binder_key_buf[6] = '\0';
  binder_key_buf[7] = '\0';
  binder_key_buf[8] = '\0';
  binder_key_buf[9] = '\0';
  binder_key_buf[10] = '\0';
  binder_key_buf[0xb] = '\0';
  binder_key_buf[0xc] = '\0';
  binder_key_buf[0xd] = '\0';
  binder_key_buf[0xe] = '\0';
  binder_key_buf[0xf] = '\0';
  iVar3 = EVP_MD_size(md);
  local_1c8 = CONCAT44(extraout_var,iVar3);
  md_00 = binder_context;
  iVar3 = EVP_Digest((void *)0x0,0,md_00,&binder_context_len,md,(ENGINE *)0x0);
  if (iVar3 == 0) {
    return false;
  }
  iVar3 = HKDF_extract(early_secret,&early_secret_len,(EVP_MD *)md,(uint8_t *)((long)out_len + 10),
                       (ulong)*(byte *)((long)out_len + 0x4a),(uint8_t *)0x0,0);
  if (iVar3 == 0) {
    return false;
  }
  local_158 = 10;
  pcStack_150 = "res binder";
  uVar4 = (ulong)binder_context_len;
  label._M_str = "res binder";
  label._M_len = 10;
  SVar5.size_._0_4_ = binder_context_len;
  SVar5.data_ = md_00;
  SVar5.size_._4_4_ = 0;
  SVar6.size_ = early_secret_len;
  SVar6.data_ = early_secret;
  out_00.size_ = local_1c8;
  out_00.data_ = binder_key_buf;
  local_168 = md_00;
  uStack_160 = uVar4;
  bVar2 = hkdf_expand_label(out_00,(EVP_MD *)md,SVar6,label,SVar5,client_hello.size_._0_1_);
  if (!bVar2) {
    return false;
  }
  if (binders_len < client_hello.data_) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x21b);
    return false;
  }
  truncated = Span<const_unsigned_char>::subspan
                        (&client_hello_local,0,binders_len - (long)client_hello.data_);
  cnt = truncated.size_;
  d = truncated.data_;
  EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
  if (client_hello.size_._0_1_ == false) {
    bVar2 = SSLTranscript::CopyToHashContext((SSLTranscript *)session,&ctx.ctx_,(EVP_MD *)md);
    if ((bVar2) && (iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,d,cnt), iVar3 != 0)) {
      iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)&ctx,context,&context_len);
LAB_0016078b:
      if (iVar3 != 0) {
        uStack_170 = (ulong)context_len;
        local_178 = context;
        secret.size_._0_4_ = context_len;
        secret.data_ = local_178;
        secret.size_._4_4_ = 0;
        context_00.size_ = uVar4;
        context_00.data_ = md_00;
        bVar2 = tls13_verify_data(this,(uint8_t *)local_1d0,(size_t *)md,(EVP_MD *)binder_key_buf,
                                  (uint16_t)local_1c8,secret,context_00,client_hello.size_._0_1_);
        if (bVar2) {
          lVar1 = *local_1d0;
          iVar3 = EVP_MD_size(md);
          bVar2 = true;
          if (lVar1 != CONCAT44(extraout_var_00,iVar3)) {
            __assert_fail("*out_len == EVP_MD_size(digest)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                          ,0x240,
                          "bool bssl::tls13_psk_binder(uint8_t *, size_t *, const SSL_SESSION *, const SSLTranscript &, Span<const uint8_t>, size_t, bool)"
                         );
          }
          goto LAB_0016081a;
        }
      }
    }
  }
  else if (0xb < cnt) {
    SVar5 = Span<const_unsigned_char>::subspan(&truncated,0,4);
    SVar6 = Span<const_unsigned_char>::subspan(&truncated,0xc,0xffffffffffffffff);
    bVar2 = SSLTranscript::CopyToHashContext((SSLTranscript *)session,&ctx.ctx_,(EVP_MD *)md);
    if (((bVar2) &&
        (iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,SVar5.data_,SVar5.size_), iVar3 != 0)) &&
       (iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,SVar6.data_,SVar6.size_), iVar3 != 0)) {
      iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)&ctx,context,&context_len);
      goto LAB_0016078b;
    }
  }
  bVar2 = false;
LAB_0016081a:
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable(&ctx);
  return bVar2;
}

Assistant:

static bool tls13_psk_binder(uint8_t *out, size_t *out_len,
                             const SSL_SESSION *session,
                             const SSLTranscript &transcript,
                             Span<const uint8_t> client_hello,
                             size_t binders_len, bool is_dtls) {
  const EVP_MD *digest = ssl_session_get_digest(session);

  // Compute the binder key.
  //
  // TODO(davidben): Ideally we wouldn't recompute early secret and the binder
  // key each time.
  uint8_t binder_context[EVP_MAX_MD_SIZE];
  unsigned binder_context_len;
  uint8_t early_secret[EVP_MAX_MD_SIZE] = {0};
  size_t early_secret_len;
  uint8_t binder_key_buf[EVP_MAX_MD_SIZE] = {0};
  auto binder_key = Span(binder_key_buf, EVP_MD_size(digest));
  if (!EVP_Digest(nullptr, 0, binder_context, &binder_context_len, digest,
                  nullptr) ||
      !HKDF_extract(early_secret, &early_secret_len, digest,
                    session->secret.data(), session->secret.size(), nullptr,
                    0) ||
      !hkdf_expand_label(binder_key, digest,
                         Span(early_secret, early_secret_len),
                         kTLS13LabelPSKBinder,
                         Span(binder_context, binder_context_len), is_dtls)) {
    return false;
  }

  // Hash the transcript and truncated ClientHello.
  if (client_hello.size() < binders_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  auto truncated = client_hello.subspan(0, client_hello.size() - binders_len);
  uint8_t context[EVP_MAX_MD_SIZE];
  unsigned context_len;
  ScopedEVP_MD_CTX ctx;
  if (!is_dtls) {
    if (!transcript.CopyToHashContext(ctx.get(), digest) ||
        !EVP_DigestUpdate(ctx.get(), truncated.data(), truncated.size()) ||
        !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
      return false;
    }
  } else {
    // In DTLS 1.3, the transcript hash is computed over only the TLS 1.3
    // handshake messages (i.e. only type and length in the header), not the
    // full DTLSHandshake messages that are in |truncated|. This code pulls
    // the header and body out of the truncated ClientHello and writes those
    // to the hash context so the correct binder value is computed.
    if (truncated.size() < DTLS1_HM_HEADER_LENGTH) {
      return false;
    }
    auto header = truncated.subspan(0, 4);
    auto body = truncated.subspan(12);
    if (!transcript.CopyToHashContext(ctx.get(), digest) ||
        !EVP_DigestUpdate(ctx.get(), header.data(), header.size()) ||
        !EVP_DigestUpdate(ctx.get(), body.data(), body.size()) ||
        !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
      return false;
    }
  }

  if (!tls13_verify_data(out, out_len, digest, session->ssl_version, binder_key,
                         Span(context, context_len), is_dtls)) {
    return false;
  }

  assert(*out_len == EVP_MD_size(digest));
  return true;
}